

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O3

void __thiscall layer::Convolution2D::predict(Convolution2D *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  tensor ppplVar6;
  tensor *pppplVar7;
  undefined1 auVar8 [16];
  longdouble lVar9;
  longdouble lVar10;
  int iVar11;
  longdouble *plVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  Convolution2D *pCVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  longdouble in_ST0;
  longdouble lVar23;
  longdouble in_ST1;
  longdouble lVar24;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  undefined6 in_stack_ffffffffffffff92;
  long local_68;
  int local_48;
  
  iVar13 = (this->super_Layer)._sizeZOut;
  if (0 < iVar13) {
    iVar11 = (this->super_Layer)._sizeYOut;
    lVar22 = 0;
    do {
      if (0 < iVar11) {
        uVar18 = (ulong)(uint)(this->super_Layer)._sizeXOut;
        local_68 = 0;
        do {
          if (0 < (int)uVar18) {
            plVar12 = (this->super_Layer)._out[lVar22][local_68];
            lVar17 = 0;
            lVar23 = in_ST0;
            lVar24 = in_ST1;
            lVar9 = in_ST2;
            lVar10 = in_ST3;
            do {
              in_ST3 = in_ST4;
              in_ST2 = lVar10;
              in_ST1 = lVar9;
              in_ST0 = lVar24;
              lVar24 = (longdouble)0;
              plVar12[lVar17] = lVar24;
              lVar14 = (long)(this->super_Layer)._sizeZWeight;
              pCVar19 = this;
              in_ST4 = in_ST5;
              if (0 < lVar14) {
                iVar13 = this->_stepY;
                iVar11 = this->_zeroPaddingY;
                uVar1 = (this->super_Layer)._sizeYWeight;
                uVar2 = this->_sizeYIn;
                pCVar19 = (Convolution2D *)(ulong)uVar2;
                lVar24 = (longdouble)0;
                lVar20 = 0;
                do {
                  if (0 < (int)uVar1) {
                    iVar3 = this->_stepX;
                    local_48 = (int)lVar17;
                    iVar4 = this->_zeroPaddingX;
                    uVar5 = (this->super_Layer)._sizeXWeight;
                    uVar18 = 0;
                    uVar16 = iVar13 * (int)local_68 - iVar11;
                    do {
                      if ((-1 < (int)uVar16 && 0 < (int)uVar5) && (int)uVar16 < (int)uVar2) {
                        ppplVar6 = (this->super_Layer)._in;
                        pppplVar7 = (this->super_Layer)._ptrWeight;
                        lVar15 = 0;
                        uVar21 = iVar3 * local_48 - iVar4;
                        do {
                          if ((int)uVar21 < (int)uVar2 && -1 < (int)uVar21) {
                            lVar24 = ppplVar6[lVar20][uVar16][uVar21] *
                                     *(longdouble *)
                                      ((long)pppplVar7[lVar22][lVar20][uVar18] + lVar15) + lVar24;
                            plVar12[lVar17] = lVar24;
                            in_ST4 = in_ST3;
                            in_ST5 = in_ST3;
                          }
                          uVar21 = uVar21 + 1;
                          lVar15 = lVar15 + 0x10;
                        } while ((ulong)uVar5 << 4 != lVar15);
                      }
                      uVar16 = uVar16 + 1;
                      uVar18 = uVar18 + 1;
                    } while (uVar18 != uVar1);
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 != lVar14);
              }
              auVar8._10_6_ = in_stack_ffffffffffffff92;
              auVar8._0_10_ = lVar24;
              (*(this->super_Layer)._fActivation)((scalar *)pCVar19,(scalar)auVar8);
              plVar12 = (this->super_Layer)._out[lVar22][local_68];
              plVar12[lVar17] = lVar23;
              lVar17 = lVar17 + 1;
              uVar18 = (ulong)(this->super_Layer)._sizeXOut;
              lVar23 = in_ST0;
              lVar24 = in_ST1;
              lVar9 = in_ST2;
              lVar10 = in_ST3;
            } while (lVar17 < (long)uVar18);
            iVar11 = (this->super_Layer)._sizeYOut;
          }
          local_68 = local_68 + 1;
        } while (local_68 < iVar11);
        iVar13 = (this->super_Layer)._sizeZOut;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < iVar13);
  }
  return;
}

Assistant:

void Convolution2D::predict()
    {
        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {
                    _out[posZOut][posYOut][posXOut] = 0;

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _out[posZOut][posYOut][posXOut] +=
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] *
                                                _in[posZKernel][posYIn][posXIn];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                    _out[posZOut][posYOut][posXOut] = _fActivation(_out[posZOut][posYOut][posXOut]);

                }
            }
        }
    }